

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

AttributeSpecSyntax * __thiscall slang::parsing::Parser::parseAttributeSpec(Parser *this)

{
  Token equals_00;
  bool bVar1;
  AttributeSpecSyntax *pAVar2;
  SyntaxFactory *in_RDI;
  Token name_00;
  TokenKind in_stack_0000002e;
  ParserBase *in_stack_00000030;
  Token equals;
  EqualsValueClauseSyntax *initializer;
  Token name;
  int in_stack_0000024c;
  Parser *in_stack_00000250;
  bitmask<slang::parsing::detail::ExpressionOptions> in_stack_0000025c;
  EqualsValueClauseSyntax *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa8;
  TokenKind in_stack_ffffffffffffffae;
  ParserBase *in_stack_ffffffffffffffb0;
  bitmask<slang::parsing::detail::ExpressionOptions> local_44;
  ParserBase *in_stack_ffffffffffffffc0;
  
  name_00 = ParserBase::expect(in_stack_00000030,in_stack_0000002e);
  bVar1 = ParserBase::peek(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffae);
  if (bVar1) {
    ParserBase::consume(in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffff98 = (EqualsValueClauseSyntax *)(in_RDI + 0x1c);
    bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_44,DisallowAttrs);
    parseSubExpression(in_stack_00000250,in_stack_0000025c,in_stack_0000024c);
    equals_00.rawLen._2_2_ = in_stack_ffffffffffffffae;
    equals_00._0_6_ = in_stack_ffffffffffffffa8;
    equals_00.info = (Info *)in_stack_ffffffffffffffb0;
    slang::syntax::SyntaxFactory::equalsValueClause
              (in_RDI,equals_00,(ExpressionSyntax *)in_stack_ffffffffffffff98);
  }
  pAVar2 = slang::syntax::SyntaxFactory::attributeSpec(in_RDI,name_00,in_stack_ffffffffffffff98);
  return pAVar2;
}

Assistant:

AttributeSpecSyntax& Parser::parseAttributeSpec() {
    auto name = expect(TokenKind::Identifier);

    EqualsValueClauseSyntax* initializer = nullptr;
    if (peek(TokenKind::Equals)) {
        auto equals = consume();
        // Nested attributes are not allowed
        initializer = &factory.equalsValueClause(
            equals, parseSubExpression(ExpressionOptions::DisallowAttrs, 0));
    }

    return factory.attributeSpec(name, initializer);
}